

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# patch_optimize_destel_well_map.hpp
# Opt level: O2

void __thiscall
PatchOptimizeDestelWellMap::inject_code(PatchOptimizeDestelWellMap *this,ROM *rom,World *world)

{
  uint32_t uVar1;
  Map *pMVar2;
  initializer_list<md::DataRegister> __l;
  initializer_list<md::AddressRegister> __l_00;
  initializer_list<unsigned_char> __l_01;
  initializer_list<md::DataRegister> __l_02;
  initializer_list<md::AddressRegister> __l_03;
  allocator_type local_11a;
  allocator_type local_119;
  undefined1 local_118 [32];
  _Vector_base<md::DataRegister,_std::allocator<md::DataRegister>_> local_f8;
  _Vector_base<md::AddressRegister,_std::allocator<md::AddressRegister>_> local_e0;
  World *local_c8;
  ROM *local_c0;
  Code func;
  AddressRegister local_40;
  
  local_c8 = world;
  local_c0 = rom;
  uVar1 = inject_func_process_entity(rom);
  func._pending_branches._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &func._pending_branches._M_t._M_impl.super__Rb_tree_header._M_header;
  func._bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  func._bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  func._bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  func._pending_branches._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  func._pending_branches._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  func._pending_branches._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  func._labels._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &func._labels._M_t._M_impl.super__Rb_tree_header._M_header;
  func._labels._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  func._labels._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  func._labels._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_118._8_8_ = local_118._8_8_ & 0xffffffffffffff00;
  local_118._0_8_ = &PTR_getXn_00246bf0;
  local_118[0x18] = '\x01';
  local_118._16_8_ = &PTR_getXn_00246bf0;
  __l._M_len = 2;
  __l._M_array = (iterator)local_118;
  func._pending_branches._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       func._pending_branches._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  func._labels._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       func._labels._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  std::vector<md::DataRegister,_std::allocator<md::DataRegister>_>::vector
            ((vector<md::DataRegister,_std::allocator<md::DataRegister>_> *)&local_f8,__l,&local_119
            );
  local_40.super_Register._code = '\0';
  local_40.super_Register.super_Param._vptr_Param = (_func_int **)&PTR_getXn_00246c60;
  __l_00._M_len = 1;
  __l_00._M_array = &local_40;
  std::vector<md::AddressRegister,_std::allocator<md::AddressRegister>_>::vector
            ((vector<md::AddressRegister,_std::allocator<md::AddressRegister>_> *)&local_e0,__l_00,
             &local_11a);
  md::Code::movem_to_stack
            (&func,(vector<md::DataRegister,_std::allocator<md::DataRegister>_> *)&local_f8,
             (vector<md::AddressRegister,_std::allocator<md::AddressRegister>_> *)&local_e0);
  std::_Vector_base<md::AddressRegister,_std::allocator<md::AddressRegister>_>::~_Vector_base
            (&local_e0);
  std::_Vector_base<md::DataRegister,_std::allocator<md::DataRegister>_>::~_Vector_base(&local_f8);
  local_118._0_8_ = &PTR_getXn_00246ce8;
  local_118._8_8_ = (pointer)0x200ff1001;
  local_f8._M_impl.super__Vector_impl_data._M_finish._0_1_ = 1;
  local_f8._M_impl.super__Vector_impl_data._M_start = (pointer)&PTR_getXn_00246bf0;
  md::Code::moveb(&func,(Param *)local_118,(Param *)&local_f8);
  local_118._0_8_ = &PTR_getXn_00246ce8;
  local_118._8_8_ = (pointer)0x200ff1001;
  md::Code::clrb(&func,(Param *)local_118);
  local_118._8_8_ = local_118._8_8_ & 0xffffffffffffff00;
  local_118._0_8_ = &PTR_getXn_00246c60;
  md::Code::lea(&func,0xff5400,(AddressRegister *)local_118);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_118,"loop",(allocator<char> *)&local_f8);
  md::Code::label(&func,(string *)local_118);
  std::__cxx11::string::~string((string *)local_118);
  local_118._8_8_ = local_118._8_8_ & 0xffffffffffffff00;
  local_118._0_8_ = &PTR_getXn_00246c60;
  md::Code::cmpa(&func,0xff5480,(AddressRegister *)local_118);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_118,"next_entity",(allocator<char> *)&local_f8);
  md::Code::beq(&func,(string *)local_118);
  std::__cxx11::string::~string((string *)local_118);
  local_118._8_8_ = local_118._8_8_ & 0xffffffffffffff00;
  local_118._0_8_ = &PTR_getXn_00246c60;
  md::Code::cmpa(&func,0xff5b00,(AddressRegister *)local_118);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_118,"ret",(allocator<char> *)&local_f8);
  md::Code::beq(&func,(string *)local_118);
  std::__cxx11::string::~string((string *)local_118);
  md::Code::jsr(&func,uVar1);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_118,"next_entity",(allocator<char> *)&local_f8);
  md::Code::label(&func,(string *)local_118);
  std::__cxx11::string::~string((string *)local_118);
  local_118._8_8_ = local_118._8_8_ & 0xffffffffffffff00;
  local_118._0_8_ = &PTR_getXn_00246c60;
  md::Code::adda(&func,0x80,(AddressRegister *)local_118);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_118,"loop",(allocator<char> *)&local_f8);
  md::Code::bra(&func,(string *)local_118);
  std::__cxx11::string::~string((string *)local_118);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_118,"ret",(allocator<char> *)&local_f8);
  md::Code::label(&func,(string *)local_118);
  std::__cxx11::string::~string((string *)local_118);
  local_118[8] = '\x01';
  local_118._0_8_ = &PTR_getXn_00246bf0;
  md::Code::notb(&func,(DataRegister *)local_118);
  local_118[8] = '\x01';
  local_118._0_8_ = &PTR_getXn_00246bf0;
  md::Code::andib(&func,'\x0f',(Param *)local_118);
  local_118._0_8_ = &PTR_getXn_00246ce8;
  local_118._8_8_ = (pointer)0x200ff1001;
  local_f8._M_impl.super__Vector_impl_data._M_finish._0_1_ = 1;
  local_f8._M_impl.super__Vector_impl_data._M_start = (pointer)&PTR_getXn_00246bf0;
  md::Code::andb(&func,(Param *)local_118,(DataRegister *)&local_f8);
  local_118[8] = '\x01';
  local_118._0_8_ = &PTR_getXn_00246bf0;
  md::Code::tstb(&func,(Param *)local_118);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_118,"no_sound",(allocator<char> *)&local_f8);
  md::Code::beq(&func,(string *)local_118);
  std::__cxx11::string::~string((string *)local_118);
  local_f8._M_impl.super__Vector_impl_data._M_start =
       (pointer)CONCAT62(local_f8._M_impl.super__Vector_impl_data._M_start._2_6_,0x6c00);
  __l_01._M_len = 2;
  __l_01._M_array = (iterator)&local_f8;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_118,__l_01,
             (allocator_type *)&local_e0);
  md::Code::trap(&func,'\0',(vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_118);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)local_118);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_118,"no_sound",(allocator<char> *)&local_f8);
  md::Code::label(&func,(string *)local_118);
  std::__cxx11::string::~string((string *)local_118);
  local_118._8_8_ = (ulong)(uint7)local_118._9_7_ << 8;
  local_118._0_8_ = &PTR_getXn_00246bf0;
  local_118[0x18] = '\x01';
  local_118._16_8_ = &PTR_getXn_00246bf0;
  __l_02._M_len = 2;
  __l_02._M_array = (iterator)local_118;
  std::vector<md::DataRegister,_std::allocator<md::DataRegister>_>::vector
            ((vector<md::DataRegister,_std::allocator<md::DataRegister>_> *)&local_f8,__l_02,
             &local_119);
  local_40.super_Register._code = '\0';
  local_40.super_Register.super_Param._vptr_Param = (_func_int **)&PTR_getXn_00246c60;
  __l_03._M_len = 1;
  __l_03._M_array = &local_40;
  std::vector<md::AddressRegister,_std::allocator<md::AddressRegister>_>::vector
            ((vector<md::AddressRegister,_std::allocator<md::AddressRegister>_> *)&local_e0,__l_03,
             &local_11a);
  md::Code::movem_from_stack
            (&func,(vector<md::DataRegister,_std::allocator<md::DataRegister>_> *)&local_f8,
             (vector<md::AddressRegister,_std::allocator<md::AddressRegister>_> *)&local_e0);
  std::_Vector_base<md::AddressRegister,_std::allocator<md::AddressRegister>_>::~_Vector_base
            (&local_e0);
  std::_Vector_base<md::DataRegister,_std::allocator<md::DataRegister>_>::~_Vector_base(&local_f8);
  md::Code::rts(&func);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_118,"",(allocator<char> *)&local_f8);
  uVar1 = md::ROM::inject_code(local_c0,&func,(string *)local_118);
  std::__cxx11::string::~string((string *)local_118);
  pMVar2 = World::map(local_c8,0x112);
  pMVar2->_map_update_addr = uVar1;
  md::Code::~Code(&func);
  return;
}

Assistant:

void inject_code(md::ROM& rom, World& world) override
    {
        uint32_t func_process_entity = inject_func_process_entity(rom);

        md::Code func;
        func.movem_to_stack({ reg_D0, reg_D1 }, { reg_A0 });
        {
            func.moveb(addr_(0xFF1001), reg_D1);    // Store old flag state in D1
            func.clrb(addr_(0xFF1001));

            func.lea(0xFF5400, reg_A0);
            func.label("loop");
            {
                func.cmpa(0xFF5480, reg_A0); // No need to check anything with the door
                func.beq("next_entity");
                func.cmpa(0xFF5B00, reg_A0); // End of array
                func.beq("ret");
                func.jsr(func_process_entity);
                func.label("next_entity");
                func.adda(0x80, reg_A0);
            }
            func.bra("loop");
        }
        func.label("ret");
        // Compare old flag state to new flag state: if any new holes have been filled, play a switch sound
        func.notb(reg_D1);
        func.andib(0x0F, reg_D1);
        func.andb(addr_(0xFF1001), reg_D1);
        func.tstb(reg_D1);
        func.beq("no_sound");
        {
            func.trap(0, { 0x00, 0x6C });
        }
        func.label("no_sound");
        func.movem_from_stack({ reg_D0, reg_D1 }, { reg_A0 });
        func.rts();

        uint32_t update_func_addr = rom.inject_code(func);
        world.map(MAP_DESTEL_WELL_274)->map_update_addr(update_func_addr);
    }